

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scan.h
# Opt level: O0

void __thiscall
charls::jls_codec<charls::lossless_traits<unsigned_char,_8>,_charls::encoder_strategy>::
encode_run_pixels(jls_codec<charls::lossless_traits<unsigned_char,_8>,_charls::encoder_strategy>
                  *this,int32_t run_length,bool end_of_line)

{
  const_reference pvVar1;
  uint32_t local_14;
  bool end_of_line_local;
  int32_t run_length_local;
  jls_codec<charls::lossless_traits<unsigned_char,_8>,_charls::encoder_strategy> *this_local;
  
  local_14 = run_length;
  while (pvVar1 = std::array<int,_32UL>::operator[]((array<int,_32UL> *)J,(long)this->run_index_),
        1 << ((byte)*pvVar1 & 0x1f) <= (int)local_14) {
    encoder_strategy::append_ones_to_bit_stream(&this->super_encoder_strategy,1);
    pvVar1 = std::array<int,_32UL>::operator[]((array<int,_32UL> *)J,(long)this->run_index_);
    local_14 = local_14 - (1 << ((byte)*pvVar1 & 0x1f));
    increment_run_index(this);
  }
  if (end_of_line) {
    if (local_14 != 0) {
      encoder_strategy::append_ones_to_bit_stream(&this->super_encoder_strategy,1);
    }
  }
  else {
    pvVar1 = std::array<int,_32UL>::operator[]((array<int,_32UL> *)J,(long)this->run_index_);
    encoder_strategy::append_to_bit_stream(&this->super_encoder_strategy,local_14,*pvVar1 + 1);
  }
  return;
}

Assistant:

void encode_run_pixels(int32_t run_length, const bool end_of_line)
    {
        while (run_length >= 1 << J[run_index_])
        {
            Strategy::append_ones_to_bit_stream(1);
            run_length = run_length - (1 << J[run_index_]);
            increment_run_index();
        }

        if (end_of_line)
        {
            if (run_length != 0)
            {
                Strategy::append_ones_to_bit_stream(1);
            }
        }
        else
        {
            Strategy::append_to_bit_stream(run_length, J[run_index_] + 1); // leading 0 + actual remaining length
        }
    }